

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

void vkt::wsi::createSwapchainTests(TestCaseGroup *testGroup,Type wsiType)

{
  TestCaseGroup *pTVar1;
  GroupParameters arg0;
  GroupParameters arg0_00;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  GroupParameters local_e8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  GroupParameters local_88;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Type local_14;
  TestCaseGroup *pTStack_10;
  Type wsiType_local;
  TestCaseGroup *testGroup_local;
  
  local_14 = wsiType;
  pTStack_10 = testGroup;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"create",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Create VkSwapchain with various parameters",&local_71);
  anon_unknown_0::GroupParameters::GroupParameters
            (&local_88,local_14,anon_unknown_0::createSwapchainTest);
  arg0._4_4_ = 0;
  arg0.wsiType = local_88.wsiType;
  arg0.function = local_88.function;
  addTestGroup<vkt::wsi::(anonymous_namespace)::GroupParameters>
            (testGroup,&local_38,&local_70,anon_unknown_0::populateSwapchainGroup,arg0);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pTVar1 = pTStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"simulate_oom",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Simulate OOM using callbacks during swapchain construction",
             &local_d1);
  anon_unknown_0::GroupParameters::GroupParameters
            (&local_e8,local_14,anon_unknown_0::createSwapchainSimulateOOMTest);
  arg0_00._4_4_ = 0;
  arg0_00.wsiType = local_e8.wsiType;
  arg0_00.function = local_e8.function;
  addTestGroup<vkt::wsi::(anonymous_namespace)::GroupParameters>
            (pTVar1,&local_a8,&local_d0,anon_unknown_0::populateSwapchainGroup,arg0_00);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pTVar1 = pTStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"render",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Rendering Tests",&local_131);
  addTestGroup<vk::wsi::Type>
            (pTVar1,&local_108,&local_130,anon_unknown_0::populateRenderGroup,local_14);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  pTVar1 = pTStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"modify",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"Modify VkSwapchain",&local_181);
  addTestGroup<vk::wsi::Type>
            (pTVar1,&local_158,&local_180,anon_unknown_0::populateModifyGroup,local_14);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pTVar1 = pTStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"destroy",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Destroy VkSwapchain",&local_1d1);
  addTestGroup<vk::wsi::Type>
            (pTVar1,&local_1a8,&local_1d0,anon_unknown_0::populateDestroyGroup,local_14);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  pTVar1 = pTStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"get_images",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Get swapchain images",&local_221);
  addTestGroup<vk::wsi::Type>
            (pTVar1,&local_1f8,&local_220,anon_unknown_0::populateGetImagesGroup,local_14);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  return;
}

Assistant:

void createSwapchainTests (tcu::TestCaseGroup* testGroup, vk::wsi::Type wsiType)
{
	addTestGroup(testGroup, "create",			"Create VkSwapchain with various parameters",					populateSwapchainGroup,		GroupParameters(wsiType, createSwapchainTest));
	addTestGroup(testGroup, "simulate_oom",		"Simulate OOM using callbacks during swapchain construction",	populateSwapchainGroup,		GroupParameters(wsiType, createSwapchainSimulateOOMTest));
	addTestGroup(testGroup, "render",			"Rendering Tests",												populateRenderGroup,		wsiType);
	addTestGroup(testGroup, "modify",			"Modify VkSwapchain",											populateModifyGroup,		wsiType);
	addTestGroup(testGroup, "destroy",			"Destroy VkSwapchain",											populateDestroyGroup,		wsiType);
	addTestGroup(testGroup, "get_images",		"Get swapchain images",											populateGetImagesGroup,		wsiType);
}